

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::insertAction(QWidget *this,QAction *before,QAction *action)

{
  QListSpecialMethodsBase<QAction*> *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *pcStack_40;
  QAction *action_local;
  QAction *before_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  action_local = action;
  before_local = before;
  if (action == (QAction *)0x0) {
    local_58 = 2;
    uStack_44 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48 = 0;
    pcStack_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,"QWidget::insertAction: Attempt to insert null action");
  }
  else {
    lVar1 = *(long *)&this->field_0x8;
    this_00 = (QListSpecialMethodsBase<QAction*> *)(lVar1 + 0x220);
    bVar2 = QListSpecialMethodsBase<QAction*>::contains<QAction*>(this_00,&action_local);
    if (bVar2) {
      removeAction(this,action_local);
    }
    qVar4 = QtPrivate::indexOf<QAction*,QAction*>((QList<QAction_*> *)this_00,&before_local,0);
    iVar3 = (int)qVar4;
    if (iVar3 < 0) {
      before_local = (QAction *)0x0;
      iVar3 = (int)*(undefined8 *)(lVar1 + 0x230);
    }
    QList<QAction_*>::insert((QList<QAction_*> *)this_00,(long)iVar3,action_local);
    QList<QObject_*>::append
              ((QList<QObject_*> *)(*(long *)(action_local + 8) + 0x140),&this->super_QObject);
    local_48 = 0xaaaaaaaa;
    uStack_44 = 0xaaaaaaaa;
    pcStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,action_local,before_local);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_58);
    QActionEvent::~QActionEvent((QActionEvent *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::insertAction(QAction *before, QAction *action)
{
    if (Q_UNLIKELY(!action)) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QWidget);
    if (d->actions.contains(action))
        removeAction(action);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    QActionPrivate *apriv = action->d_func();
    apriv->associatedObjects.append(this);

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}